

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry.c
# Opt level: O1

void compute_ui_entry_values_for_object
               (ui_entry *entry,object *obj,player *p,cached_object_data **cache,int *val,
               int *auxval)

{
  byte bVar1;
  wchar_t element;
  bound_object_property *pbVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  curse_data *pcVar8;
  _Bool _Var9;
  bool bVar10;
  int iVar11;
  int iVar12;
  cached_object_data *pcVar13;
  uint uVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  uint uVar18;
  int iVar19;
  uint uVar20;
  bool bVar21;
  bool bVar22;
  ui_entry_combiner_state_conflict cst;
  ui_entry_combiner_funcs_conflict combiner;
  int local_9c;
  ui_entry_combiner_state local_88;
  cached_object_data *local_70;
  int *local_68;
  ui_entry_combiner_funcs local_60;
  int *local_40;
  curse_data *local_38;
  
  local_88.work = (void *)0x0;
  local_88.accum = 0;
  local_88.accum_aux = 0;
  if ((obj == (object *)0x0) || (entry->n_obj_prop == L'\0')) {
    *val = 0x7ffffffe;
    local_88.accum_aux = 0x7ffffffe;
    goto LAB_001e2efa;
  }
  local_68 = val;
  if (*cache == (cached_object_data *)0x0) {
    pcVar13 = (cached_object_data *)mem_alloc(6);
    *cache = pcVar13;
    flag_wipe((bitflag *)pcVar13,6);
    if (p == (player *)0x0) {
      object_flags(obj,(*cache)->f);
    }
    else {
      object_flags_known(obj,(*cache)->f);
    }
  }
  local_40 = auxval;
  iVar11 = ui_entry_combiner_get_funcs(entry->combiner_index,&local_60);
  if (iVar11 != 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-entry.c"
                  ,0x27b,
                  "void compute_ui_entry_values_for_object(const struct ui_entry *, const struct object *, const struct player *, struct cached_object_data **, int *, int *)"
                 );
  }
  local_70 = *cache;
  local_38 = obj->curses;
  bVar7 = true;
  bVar10 = true;
  bVar3 = true;
  local_9c = 0;
  iVar11 = 0;
  bVar5 = false;
  bVar4 = true;
  bVar6 = false;
  do {
    if (L'\0' < entry->n_obj_prop) {
      lVar17 = 0;
      lVar16 = 0;
      do {
        pbVar2 = entry->obj_props;
        element = *(wchar_t *)((long)&pbVar2->index + lVar17);
        if ((&pbVar2->isaux)[lVar17] == true) {
          bVar22 = true;
          if ((entry->flags & L'\x01') == L'\0') goto LAB_001e2b00;
          goto switchD_001e2b1c_default;
        }
        bVar4 = false;
        bVar22 = bVar6;
LAB_001e2b00:
        bVar6 = bVar22;
        switch(*(undefined4 *)((long)&pbVar2->type + lVar17)) {
        case 1:
        case 2:
          if (((p != (player *)0x0) && (p->obj_k->modifiers[element] == 0)) &&
             (obj->modifiers[element] != 0)) goto LAB_001e2d4a;
          uVar20 = (uint)obj->modifiers[element];
          if (obj->modifiers[element] == 0) {
            uVar20 = 0;
          }
          else if ((&pbVar2->have_value)[lVar17] == true) {
            uVar20 = *(uint *)((long)&pbVar2->value + lVar17);
          }
          bVar22 = (&pbVar2->isaux)[lVar17] != false;
          uVar14 = 0;
          if (bVar22) {
            bVar3 = false;
          }
          if (!bVar22) {
            bVar10 = false;
            uVar14 = uVar20;
            uVar20 = 0;
          }
LAB_001e2cf3:
          if (bVar7) {
            (*local_60.init_func)(uVar14,uVar20,&local_88);
LAB_001e2d03:
            bVar7 = false;
          }
          else {
            (*local_60.accum_func)(uVar14,uVar20,&local_88);
          }
          break;
        case 3:
          if ((p == (player *)0x0) || (_Var9 = object_flag_is_known(p,obj,element), _Var9)) {
            _Var9 = flag_has_dbg(local_70->f,6,element,"cache2->f","ind");
            uVar18 = (uint)_Var9;
            if (_Var9) {
LAB_001e2bdc:
              if ((&entry->obj_props->have_value)[lVar17] == true) {
                uVar18 = *(uint *)((long)&entry->obj_props->value + lVar17);
              }
            }
LAB_001e2bec:
            bVar21 = (&entry->obj_props->isaux)[lVar17] != false;
            bVar22 = false;
            if (bVar21) {
              bVar3 = false;
              bVar22 = bVar10;
            }
            bVar10 = bVar22;
            uVar14 = uVar18;
            uVar20 = 0;
            if (bVar21) {
              uVar14 = 0;
              uVar20 = uVar18;
            }
            goto LAB_001e2cf3;
          }
          goto LAB_001e2d4a;
        case 4:
          if ((p == (player *)0x0) || (_Var9 = object_element_is_known(p,obj,element), _Var9)) {
            iVar12 = (int)obj->el_info[element].res_level;
            iVar19 = 100;
            if ((iVar12 != 100) &&
               (iVar19 = iVar12, (&entry->obj_props->have_value)[lVar17] == true)) {
              iVar19 = *(int *)((long)&entry->obj_props->value + lVar17);
            }
            bVar21 = (&entry->obj_props->isaux)[lVar17] != false;
            bVar22 = false;
            if (bVar21) {
              bVar3 = false;
              bVar22 = bVar10;
            }
            bVar10 = bVar22;
            iVar12 = 100;
            if (bVar21) {
              iVar12 = iVar19;
              iVar19 = 100;
            }
            if (bVar7) {
              (*local_60.init_func)(iVar19,iVar12,&local_88);
              local_9c = 100;
              goto LAB_001e2d03;
            }
            (*local_60.accum_func)(iVar19,iVar12,&local_88);
            local_9c = 100;
          }
          else {
            if (0 < iVar11) {
              bVar5 = true;
            }
            local_9c = 100;
          }
          break;
        case 5:
          if ((p == (player *)0x0) || (_Var9 = object_element_is_known(p,obj,element), _Var9)) {
            bVar1 = obj->el_info[element].flags;
            uVar18 = (bVar1 & 2) >> 1;
            if ((bVar1 & 2) != 0) goto LAB_001e2bdc;
            goto LAB_001e2bec;
          }
LAB_001e2d4a:
          if (0 < iVar11) {
            bVar5 = true;
          }
        }
switchD_001e2b1c_default:
        lVar16 = lVar16 + 1;
        lVar17 = lVar17 + 0x10;
      } while (lVar16 < entry->n_obj_prop);
    }
    pcVar8 = local_38;
    if (local_38 == (curse_data *)0x0) {
      obj = (object *)0x0;
    }
    else {
      pcVar13 = local_70;
      if (iVar11 == 0) {
        pcVar13 = (cached_object_data *)mem_alloc(6);
      }
      lVar17 = (long)iVar11;
      lVar16 = lVar17 * 7 + 3;
      do {
        lVar15 = lVar16;
        lVar17 = lVar17 + 1;
        iVar11 = iVar11 + 1;
        local_70 = pcVar13;
        if ((long)(ulong)z_info->curse_max <= lVar17) {
          mem_free(pcVar13);
          obj = (object *)0x0;
          goto LAB_001e2e4b;
        }
        lVar16 = lVar15 + 7;
      } while (pcVar8[lVar17].power == L'\0');
      obj = *(object **)(curses[1].conflict_flags + lVar15 * 8 + -0x28);
      flag_wipe(pcVar13->f,6);
      if (p == (player *)0x0) {
        object_flags(obj,pcVar13->f);
      }
      else {
        object_flags_known(obj,pcVar13->f);
      }
    }
LAB_001e2e4b:
    auxval = local_40;
  } while (obj != (object *)0x0);
  if (bVar10) {
    if (bVar3) {
      iVar11 = 0x7fffffff;
      if (bVar4) {
        iVar11 = local_9c;
      }
      *local_68 = iVar11;
      local_88.accum_aux = local_9c;
      if (bVar6) {
        local_88.accum_aux = 0x7fffffff;
      }
      goto LAB_001e2efa;
    }
    (*local_60.finish_func)(&local_88);
LAB_001e2ec2:
    iVar11 = 0x7fffffff;
    if (bVar4) {
      iVar11 = local_9c;
    }
  }
  else {
    (*local_60.finish_func)(&local_88);
    iVar11 = local_88.accum;
    if ((local_88.accum == local_9c) && (bVar5)) goto LAB_001e2ec2;
  }
  *local_68 = iVar11;
  if (((bVar3) || ((local_88.accum_aux == local_9c && (bVar5)))) &&
     (local_88.accum_aux = local_9c, bVar6)) {
    local_88.accum_aux = 0x7fffffff;
  }
LAB_001e2efa:
  *auxval = local_88.accum_aux;
  return;
}

Assistant:

void compute_ui_entry_values_for_object(const struct ui_entry *entry,
	const struct object *obj, const struct player *p,
	struct cached_object_data **cache, int *val, int *auxval)
{
	struct ui_entry_combiner_state cst = { 0, 0, 0 };
	struct ui_entry_combiner_funcs combiner;
	const struct curse_data *curse;
	struct cached_object_data *cache2;
	bool first, all_unknown, all_aux_unknown, any_aux, all_aux;
	bool any_curse_unknown;
	int curse_ind;
	int base = 0;

	if (!obj || !entry->n_obj_prop) {
		*val = UI_ENTRY_VALUE_NOT_PRESENT;
		*auxval = UI_ENTRY_VALUE_NOT_PRESENT;
		return;
	}
	if (*cache == NULL) {
		*cache = mem_alloc(sizeof(**cache));
		of_wipe((*cache)->f);
		if (p) {
			object_flags_known(obj, (*cache)->f);
		} else {
			object_flags(obj, (*cache)->f);
		}
	}
	first = true;
	all_unknown = true;
	all_aux_unknown = true;
	any_aux = false;
	all_aux = true;
	if (ui_entry_combiner_get_funcs(entry->combiner_index, &combiner)) {
		assert(0);
	}
	cache2 = *cache;
	curse = obj->curses;
	any_curse_unknown = false;
	curse_ind = 0;
	while (obj) {
		int i;

		for (i = 0; i < entry->n_obj_prop; ++i) {
			int ind = entry->obj_props[i].index;

			if (entry->obj_props[i].isaux) {
				if (entry->flags & ENTRY_FLAG_TIMED_AUX) {
					continue;
				}
				any_aux = true;
			} else {
				all_aux = false;
			}

			switch (entry->obj_props[i].type) {
			case OBJ_PROPERTY_STAT:
			case OBJ_PROPERTY_MOD:
				if (!p || p->obj_k->modifiers[ind] != 0 ||
					obj->modifiers[ind] == 0) {
					int v = obj->modifiers[ind];
					int a = 0;

					if (v && entry->obj_props[i].have_value) {
						v = entry->obj_props[i].value;
					}
					if (entry->obj_props[i].isaux) {
						int t = a;

						a = v;
						v = t;
						all_aux_unknown = false;
					} else {
						all_unknown = false;
					}
					if (first) {
						(*combiner.init_func)(v, a, &cst);
						first = false;
					} else {
						(*combiner.accum_func)(v, a, &cst);
					}
				} else if (curse_ind > 0) {
					any_curse_unknown = true;
				}
				break;

			case OBJ_PROPERTY_FLAG:
				if (!p || object_flag_is_known(p, obj, ind)) {
					int v = of_has(cache2->f, ind) ? 1 : 0;
					int a = 0;

					if (v && entry->obj_props[i].have_value) {
						v = entry->obj_props[i].value;
					}
					if (entry->obj_props[i].isaux) {
						int t = a;

						a = v;
						v = t;
						all_aux_unknown = false;
					} else {
						all_unknown = false;
					}
					if (first) {
						(*combiner.init_func)(v, a, &cst);
						first = false;
					} else {
						(*combiner.accum_func)(v, a, &cst);
					}
				} else if (curse_ind > 0) {
					any_curse_unknown = true;
				}
				break;

			case OBJ_PROPERTY_IGNORE:
				if (!p || object_element_is_known(p, obj, ind)) {
					int v = (obj->el_info[ind].flags &
						EL_INFO_IGNORE) ? 1 : 0;
					int a = 0;

					if (v && entry->obj_props[i].have_value) {
						v = entry->obj_props[i].value;
					}
					if (entry->obj_props[i].isaux) {
						int t = a;

						a = v;
						v = t;
						all_aux_unknown = false;
					} else {
						all_unknown = false;
					}
					if (first) {
						(*combiner.init_func)(v, a, &cst);
						first = false;
					} else {
						(*combiner.accum_func)(v, a, &cst);
					}
				} else if (curse_ind > 0) {
					any_curse_unknown = true;
				}
				break;

			case OBJ_PROPERTY_ELEMENT:
				base = RES_LEVEL_BASE;
				if (!p || object_element_is_known(p, obj, ind)) {
					int v = obj->el_info[ind].res_level;
					int a = RES_LEVEL_BASE;

					if (v != base && entry->obj_props[i].have_value) {
						v = entry->obj_props[i].value;
					}
					if (entry->obj_props[i].isaux) {
						int t = a;

						a = v;
						v = t;
						all_aux_unknown = false;
					} else {
						all_unknown = false;
					}
					if (first) {
						(*combiner.init_func)(v, a, &cst);
						first = false;
					} else {
						(*combiner.accum_func)(v, a, &cst);
					}
				} else if (curse_ind > 0) {
					any_curse_unknown = true;
				}
				break;

			default:
				break;
			}
		}

		if (curse) {
			/*
			 * Proceed to the next unprocessed curse object.
			 * Don't overwrite the cached data for the base.
			 */
			obj = NULL;
			if (curse_ind == 0) {
				cache2 = mem_alloc(sizeof(*cache2));
			}
			++curse_ind;
			while (1) {
				if (curse_ind >= z_info->curse_max) {
					mem_free(cache2);
					break;
				}
				if (curse[curse_ind].power) {
					obj = curses[curse_ind].obj;
					of_wipe(cache2->f);
					if (p) {
						object_flags_known(obj,
							cache2->f);
					} else {
						object_flags(obj, cache2->f);
					}
					break;
				}
				++curse_ind;
			}
		} else {
			obj = NULL;
		}
	}
	if (all_unknown && all_aux_unknown) {
		*val = (all_aux) ? base : UI_ENTRY_UNKNOWN_VALUE;
		*auxval = (any_aux) ? UI_ENTRY_UNKNOWN_VALUE : base;
	} else {
		(*combiner.finish_func)(&cst);
		if (all_unknown || (cst.accum == base && any_curse_unknown)) {
			*val = (all_aux) ? base : UI_ENTRY_UNKNOWN_VALUE;
		} else {
			*val = cst.accum;
		}
		if (all_aux_unknown || (cst.accum_aux == base && any_curse_unknown)) {
			*auxval = (any_aux) ? UI_ENTRY_UNKNOWN_VALUE : base;
		} else {
			*auxval = cst.accum_aux;
		}
	}
}